

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStdIO.cpp
# Opt level: O3

bool Imf_3_2::anon_unknown_0::checkError(istream *is,streamsize expected)

{
  uint uVar1;
  int *piVar2;
  ostream *poVar3;
  InputExc *this;
  stringstream _iex_throw_s;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  uVar1 = *(uint *)(is + *(long *)(*(long *)is + -0x18) + 0x20);
  if ((uVar1 & 5) != 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0) {
      Iex_3_2::throwErrnoExc();
    }
    if (*(long *)(is + 8) < expected) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(asStack_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"Early end of file: read ",0x18);
      poVar3 = std::ostream::_M_insert<long>((long)local_198);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," out of ",8);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," requested bytes.",0x11);
      this = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::InputExc::InputExc(this,asStack_1a8);
      __cxa_throw(this,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
    }
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool
checkError (istream& is, streamsize expected = 0)
{
    if (!is)
    {
        if (errno) IEX_NAMESPACE::throwErrnoExc ();

        if (is.gcount () < expected)
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "Early end of file: read " << is.gcount () << " out of "
                                           << expected << " requested bytes.");
        }
        return false;
    }

    return true;
}